

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  long lVar2;
  Slice *pSVar3;
  size_t sVar4;
  ulong *in_RSI;
  long in_FS_OFFSET;
  size_t digits_consumed;
  uint8_t ch;
  uint8_t *current;
  uint8_t *end;
  uint8_t *start;
  uint64_t value;
  char kLastDigitOfMaxUint64;
  uint64_t kMaxUint64;
  Slice *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  Slice *this;
  Slice *local_50;
  ulong local_38;
  bool local_9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  pSVar3 = (Slice *)Slice::data(in_stack_ffffffffffffff88);
  this = pSVar3;
  sVar4 = Slice::size(in_stack_ffffffffffffff88);
  local_50 = pSVar3;
  do {
    if (((local_50 == (Slice *)((long)&this->data_ + sVar4)) ||
        (bVar1 = *(byte *)&local_50->data_, bVar1 < 0x30)) || (0x39 < bVar1)) {
      *in_RSI = local_38;
      Slice::remove_prefix(this,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      local_9 = local_50 != pSVar3;
LAB_00d58ba1:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return local_9;
    }
    if ((0x1999999999999999 < local_38) || ((local_38 == 0x1999999999999999 && (0x35 < bVar1)))) {
      local_9 = false;
      goto LAB_00d58ba1;
    }
    local_38 = local_38 * 10 + (long)(int)(bVar1 - 0x30);
    local_50 = (Slice *)((long)&local_50->data_ + 1);
  } while( true );
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}